

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O2

int adl_switchEmulator(ADL_MIDIPlayer *device,int emulator)

{
  MIDIplay *this;
  bool bVar1;
  int iVar2;
  allocator local_41;
  string local_40;
  
  iVar2 = -1;
  if (device != (ADL_MIDIPlayer *)0x0) {
    this = (MIDIplay *)device->adl_midiPlayer;
    if (this == (MIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x354,"int adl_switchEmulator(struct ADL_MIDIPlayer *, int)");
    }
    bVar1 = adl_isEmulatorAvailable(emulator);
    if (bVar1) {
      (this->m_setup).emulator = emulator;
      MIDIplay::partialReset(this);
      iVar2 = 0;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_40,"OPL3 MIDI: Unknown emulation core!",&local_41);
      MIDIplay::setErrorString(this,&local_40);
      std::__cxx11::string::_M_dispose();
    }
  }
  return iVar2;
}

Assistant:

ADLMIDI_EXPORT int adl_switchEmulator(struct ADL_MIDIPlayer *device, int emulator)
{
    if(device)
    {
        MidiPlayer *play = GET_MIDI_PLAYER(device);
        assert(play);
        if(adl_isEmulatorAvailable(emulator))
        {
            play->m_setup.emulator = emulator;
#ifdef ADLMIDI_ENABLE_HW_SERIAL
            play->m_setup.serial = false;
#endif
            play->partialReset();
            return 0;
        }
        play->setErrorString("OPL3 MIDI: Unknown emulation core!");
    }
    return -1;
}